

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_convert_q_to_qindex(double q,aom_bit_depth_t bit_depth)

{
  int qindex;
  int qindex_00;
  double dVar1;
  
  qindex_00 = 0;
  do {
    dVar1 = av1_convert_qindex_to_q(qindex_00,bit_depth);
    if (q <= dVar1) {
      return qindex_00;
    }
    qindex_00 = qindex_00 + 1;
  } while (qindex_00 != 0xff);
  return 0xff;
}

Assistant:

int av1_convert_q_to_qindex(double q, aom_bit_depth_t bit_depth) {
  int qindex = MINQ;

  // Find the first qindex that matches or exceeds q.
  // Note: this operation can also be done with a binary search, as
  // av1_convert_qindex_to_q() is monotonically increasing with respect to
  // increasing qindex.
  while (qindex < MAXQ && av1_convert_qindex_to_q(qindex, bit_depth) < q) {
    qindex++;
  }

  return qindex;
}